

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

expression_ptr __thiscall
mjs::parser::parse_expression1(parser *this,expression_ptr *lhs,int outer_precedence)

{
  token_type tt;
  expression *peVar1;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> uVar2;
  __uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_> _Var3;
  undefined8 uVar4;
  bool bVar5;
  wchar_t wVar6;
  int iVar7;
  wchar_t wVar8;
  uint uVar9;
  wostream *pwVar10;
  wchar_t in_ECX;
  undefined4 in_register_00000014;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args_1;
  wchar_t *extraout_RDX;
  wstring_view *s;
  element_type *peVar11;
  wchar_t *in_R9;
  byte bVar12;
  wstring_view name;
  wstring_view message;
  token_type op;
  wostringstream _oss;
  undefined1 local_250 [16];
  undefined1 local_240 [40];
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_208;
  parser local_1f8 [2];
  token local_80;
  token local_58;
  
  args_1 = (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
           CONCAT44(in_register_00000014,outer_precedence);
  bVar12 = *(int *)&lhs[2]._M_t.
                    super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                    .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl < 1 |
           *(byte *)((long)&lhs[0xf]._M_t.
                            super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                            .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl + 1);
  local_240._24_8_ = args_1;
  local_240._36_4_ = in_ECX;
  local_208._8_8_ = this;
  do {
    local_240._20_4_ =
         *(undefined4 *)
          &lhs[0x10]._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    wVar6 = L'd';
    if ((bVar12 & local_240._20_4_ == in_) == 0) {
      wVar6 = operator_precedence(local_240._20_4_);
    }
    if ((int)local_240._36_4_ < wVar6) {
      *(expression **)local_208._8_8_ =
           (args_1->_M_t).
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
      (args_1->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
      return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
             (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
             local_208._8_8_;
    }
    get_token(&local_58,(parser *)lhs);
    token::destroy(&local_58);
    if (local_240._20_4_ == question) {
      parse_assignment_expression(local_1f8);
      expect(&local_80,(parser *)lhs,colon,"parse_expression1",0x259);
      token::destroy(&local_80);
      parse_assignment_expression((parser *)local_218);
      make_expression<mjs::conditional_expression,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)local_250,lhs,args_1,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_1f8);
      uVar4 = local_250._0_8_;
      local_250._0_8_ = (element_type *)0x0;
      peVar1 = (args_1->_M_t).
               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
               super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
      (args_1->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)uVar4;
      if (peVar1 != (expression *)0x0) {
        (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 8))();
        if ((element_type *)local_250._0_8_ != (element_type *)0x0) {
          (**(code **)(*(long *)local_250._0_8_ + 8))();
        }
      }
      local_250._0_8_ = (element_type *)0x0;
      peVar11 = (element_type *)local_218._0_8_;
LAB_0017b9d8:
      if (peVar11 != (element_type *)0x0) {
        (**(code **)(*(long *)peVar11 + 8))();
      }
    }
    else {
      if (*(char *)&lhs[0xc]._M_t.
                    super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                    .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == '\x01') {
        bVar5 = is_assignment_op(local_240._20_4_);
        if (bVar5) {
          uVar2._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
          _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
          super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
               *(__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>
                 *)local_240._24_8_;
          iVar7 = (**(code **)(*(long *)uVar2._M_t.
                                        super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                                        .super__Head_base<0UL,_mjs::expression_*,_false>.
                                        _M_head_impl + 0x18))
                            (uVar2._M_t.
                             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                             .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
          if (iVar7 == 0) {
            name._M_str = extraout_RDX;
            name._M_len = *(size_t *)
                           ((long)uVar2._M_t.
                                  super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                                  .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl +
                           0x20);
            bVar5 = is_strict_mode_unassignable_identifier
                              (*(mjs **)((long)uVar2._M_t.
                                               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                                               .super__Head_base<0UL,_mjs::expression_*,_false>.
                                               _M_head_impl + 0x28),name);
            if (bVar5) {
              std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1f8);
              pwVar10 = std::operator<<((wostream *)local_1f8,"\"");
              local_218._8_8_ =
                   *(undefined8 *)
                    ((long)*(__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>
                             *)local_240._24_8_ + 0x20);
              local_218._0_8_ =
                   *(undefined8 *)
                    ((long)*(__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>
                             *)local_240._24_8_ + 0x28);
              cpp_quote_abi_cxx11_((wstring *)local_250,(mjs *)local_218,s);
              pwVar10 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                  (pwVar10,(wchar_t *)local_250._0_8_,local_250._8_8_);
              std::operator<<(pwVar10,"\" may not be assigned in strict mode");
              if ((element_type *)local_250._0_8_ != (element_type *)local_240) {
                operator_delete((void *)local_250._0_8_,local_240._0_8_ * 4 + 4);
              }
              local_218._0_8_ =
                   (lhs->_M_t).
                   super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                   super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
              local_218._8_8_ =
                   lhs[1]._M_t.
                   super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                   super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&((shared_ptr<mjs::source_file> *)
                           &((syntax_node *)
                            &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->
                             _M_use_count)->_vptr_syntax_node)->
                           super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> =
                       *(int *)&((shared_ptr<mjs::source_file> *)
                                &((syntax_node *)
                                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)
                                  ->_M_use_count)->_vptr_syntax_node)->
                                super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> + 1
                  ;
                  UNLOCK();
                }
                else {
                  *(int *)&((shared_ptr<mjs::source_file> *)
                           &((syntax_node *)
                            &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->
                             _M_use_count)->_vptr_syntax_node)->
                           super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> =
                       *(int *)&((shared_ptr<mjs::source_file> *)
                                &((syntax_node *)
                                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)
                                  ->_M_use_count)->_vptr_syntax_node)->
                                super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> + 1
                  ;
                }
              }
              local_208._M_local_buf[0] =
                   *(wchar_t *)
                    ((long)&lhs[0xc]._M_t.
                            super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                            .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl + 4);
              local_208._M_local_buf[1] =
                   *(undefined4 *)
                    &lhs[6]._M_t.
                     super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                     .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
              std::__cxx11::wstringbuf::str();
              message._M_str = in_R9;
              message._M_len = local_250._0_8_;
              syntax_error((parser *)"parse_expression1",(char *)0x25e,(int)local_218,
                           (source_extend *)local_250._8_8_,message);
            }
          }
        }
      }
      parse_unary_expression(local_1f8);
      while( true ) {
        tt = *(token_type *)
              &lhs[0x10]._M_t.
               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
               super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
        wVar8 = L'd';
        if ((bVar12 & tt == in_) == 0) {
          wVar8 = operator_precedence(tt);
        }
        if ((uint)wVar6 < (uint)wVar8) break;
        if (wVar8 == wVar6) {
          uVar9 = operator_precedence(tt);
          if (uVar9 < 0xf) break;
        }
        parse_expression1((parser *)local_250,lhs,(int)local_1f8);
        peVar11 = local_1f8[0].source_.
                  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1f8[0].source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)local_250._0_8_;
        local_250._0_8_ = (element_type *)0x0;
        if (peVar11 != (element_type *)0x0) {
          (**(code **)(*(long *)peVar11 + 8))();
          if ((element_type *)local_250._0_8_ != (element_type *)0x0) {
            (**(code **)(*(long *)local_250._0_8_ + 8))();
          }
        }
      }
      args_1 = (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
               local_240._24_8_;
      make_expression<mjs::binary_expression,mjs::token_type_const&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)local_250,(token_type *)lhs,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                 (local_240 + 0x14),
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                 local_240._24_8_);
      uVar4 = local_250._0_8_;
      local_250._0_8_ = (element_type *)0x0;
      _Var3._M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
           *(tuple<mjs::expression_*,_std::default_delete<mjs::expression>_> *)args_1;
      *args_1 = (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>)uVar4;
      if ((__uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>)
          _Var3._M_t.
          super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
          super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>)0x0) {
        (**(code **)(*(long *)_Var3._M_t.
                              super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                              .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl + 8))();
        peVar11 = (element_type *)local_250._0_8_;
        goto LAB_0017b9d8;
      }
    }
    if (local_1f8[0].source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      (**(code **)(*(long *)local_1f8[0].source_.
                            super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  + 8))();
    }
  } while( true );
}

Assistant:

expression_ptr parse_expression1(expression_ptr&& lhs, int outer_precedence) {
        auto prec = [no_in=supress_in_ || version_ < version::es3](token_type t) { return !no_in || t != token_type::in_ ? operator_precedence(t) : 100; };

        for (;;) {
            const auto op = current_token_type();
            const auto precedence = prec(op);
            if (precedence > outer_precedence) {
                break;
            }
            get_token();
            if (op == token_type::question) {
                auto l = parse_assignment_expression();
                EXPECT(token_type::colon);
                lhs = make_expression<conditional_expression>(std::move(lhs), std::move(l), parse_assignment_expression());
                continue;
            }
            if (strict_mode_ && is_assignment_op(op) && is_strict_mode_unassignable_identifier(*lhs)) {
                SYNTAX_ERROR("\"" << cpp_quote(static_cast<const identifier_expression&>(*lhs).id()) << "\" may not be assigned in strict mode");
            }

            auto rhs = parse_unary_expression();
            for (;;) {
                const auto look_ahead = current_token_type();
                const auto look_ahead_precedence = prec(look_ahead);
                if (look_ahead_precedence > precedence || (look_ahead_precedence == precedence && !is_right_to_left(look_ahead))) {
                    break;
                }
                rhs = parse_expression1(std::move(rhs), look_ahead_precedence);
            }

            lhs = make_expression<binary_expression>(op, std::move(lhs), std::move(rhs));
        }
        return std::move(lhs);
    }